

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strutil.cc
# Opt level: O2

char * google::protobuf::FloatToBuffer(float value,char *buffer)

{
  bool bVar1;
  int iVar2;
  LogMessage *pLVar3;
  LogFinisher local_59;
  float parsed_value;
  float local_54;
  double local_50;
  LogMessage local_48;
  
  if (INFINITY <= value) {
    builtin_strncpy(buffer,"inf",4);
    return buffer;
  }
  if (value <= -INFINITY) {
    builtin_strncpy(buffer,"-inf",5);
    return buffer;
  }
  if (NAN(value)) {
    builtin_strncpy(buffer,"nan",4);
    return buffer;
  }
  local_50 = (double)value;
  local_54 = value;
  iVar2 = snprintf(buffer,0x18,"%.*g",6);
  if (iVar2 - 0x18U < 0xffffffe9) {
    internal::LogMessage::LogMessage
              (&local_48,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/hyperion-project[P]protobuf/src/google/protobuf/stubs/strutil.cc"
               ,0x46b);
    pLVar3 = internal::LogMessage::operator<<
                       (&local_48,
                        "CHECK failed: snprintf_result > 0 && snprintf_result < kFloatToBufferSize: "
                       );
    internal::LogFinisher::operator=((LogFinisher *)&parsed_value,pLVar3);
    internal::LogMessage::~LogMessage(&local_48);
  }
  bVar1 = safe_strtof(buffer,&parsed_value);
  if (bVar1) {
    if ((parsed_value == local_54) && (!NAN(parsed_value) && !NAN(local_54))) goto LAB_0019076b;
  }
  iVar2 = snprintf(buffer,0x18,"%.*g",local_50,8);
  if (iVar2 - 0x18U < 0xffffffe9) {
    internal::LogMessage::LogMessage
              (&local_48,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/hyperion-project[P]protobuf/src/google/protobuf/stubs/strutil.cc"
               ,0x473);
    pLVar3 = internal::LogMessage::operator<<
                       (&local_48,
                        "CHECK failed: snprintf_result > 0 && snprintf_result < kFloatToBufferSize: "
                       );
    internal::LogFinisher::operator=(&local_59,pLVar3);
    internal::LogMessage::~LogMessage(&local_48);
  }
LAB_0019076b:
  DelocalizeRadix(buffer);
  return buffer;
}

Assistant:

char* FloatToBuffer(float value, char* buffer) {
  // FLT_DIG is 6 for IEEE-754 floats, which are used on almost all
  // platforms these days.  Just in case some system exists where FLT_DIG
  // is significantly larger -- and risks overflowing our buffer -- we have
  // this assert.
  GOOGLE_COMPILE_ASSERT(FLT_DIG < 10, FLT_DIG_is_too_big);

  if (value == numeric_limits<double>::infinity()) {
    strcpy(buffer, "inf");
    return buffer;
  } else if (value == -numeric_limits<double>::infinity()) {
    strcpy(buffer, "-inf");
    return buffer;
  } else if (IsNaN(value)) {
    strcpy(buffer, "nan");
    return buffer;
  }

  int snprintf_result =
    snprintf(buffer, kFloatToBufferSize, "%.*g", FLT_DIG, value);

  // The snprintf should never overflow because the buffer is significantly
  // larger than the precision we asked for.
  GOOGLE_DCHECK(snprintf_result > 0 && snprintf_result < kFloatToBufferSize);

  float parsed_value;
  if (!safe_strtof(buffer, &parsed_value) || parsed_value != value) {
    int snprintf_result =
      snprintf(buffer, kFloatToBufferSize, "%.*g", FLT_DIG+2, value);

    // Should never overflow; see above.
    GOOGLE_DCHECK(snprintf_result > 0 && snprintf_result < kFloatToBufferSize);
  }

  DelocalizeRadix(buffer);
  return buffer;
}